

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aistr.cpp
# Opt level: O0

void __thiscall
Test_aistr_checkPointerNotNull_Test::TestBody(Test_aistr_checkPointerNotNull_Test *this)

{
  bool bVar1;
  AssertHelper local_98;
  Message local_90;
  AssertHelper local_88;
  Message local_80 [2];
  invalid_argument *anon_var_0_1;
  char *pcStack_68;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  char *ptr;
  char buf [10];
  Message local_40 [2];
  invalid_argument *anon_var_0;
  byte local_19;
  char *pcStack_18;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Test_aistr_checkPointerNotNull_Test *this_local;
  
  gtest_msg.value = (char *)this;
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffffe8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffffe8);
  if (bVar1) {
    local_19 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      ai::checkPointerNotNull((char *)0x0);
    }
    if ((local_19 & 1) == 0) {
      pcStack_18 = 
      "Expected: ai::checkPointerNotNull(nullptr) throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
      ;
      goto LAB_001172d4;
    }
  }
  else {
LAB_001172d4:
    testing::Message::Message(local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(buf + 2),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
               ,0x19,pcStack_18);
    testing::internal::AssertHelper::operator=((AssertHelper *)(buf + 2),local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(buf + 2));
    testing::Message::~Message(local_40);
  }
  gtest_msg_1.value = (char *)0x0;
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff98,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff98);
  if (bVar1) {
    anon_var_0_1._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      ai::checkPointerNotNull(gtest_msg_1.value);
    }
    if ((anon_var_0_1._7_1_ & 1) != 0) goto LAB_0011748b;
    pcStack_68 = 
    "Expected: ai::checkPointerNotNull(ptr) throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_80);
  testing::internal::AssertHelper::AssertHelper
            (&local_88,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
             ,0x1c,pcStack_68);
  testing::internal::AssertHelper::operator=(&local_88,local_80);
  testing::internal::AssertHelper::~AssertHelper(&local_88);
  testing::Message::~Message(local_80);
LAB_0011748b:
  gtest_msg_1.value = (char *)((long)&ptr + 6);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      ai::checkPointerNotNull(gtest_msg_1.value);
    }
  }
  else {
    testing::Message::Message(&local_90);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
               ,0x1e,
               "Expected: ai::checkPointerNotNull(ptr) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_98,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    testing::Message::~Message(&local_90);
  }
  return;
}

Assistant:

TEST_F(Test_aistr, checkPointerNotNull) {
    EXPECT_THROW(ai::checkPointerNotNull(nullptr), std::invalid_argument);
    char buf[10];
    char* ptr = nullptr;
    EXPECT_THROW(ai::checkPointerNotNull(ptr), std::invalid_argument);
    ptr = &buf[0];
    EXPECT_NO_THROW(ai::checkPointerNotNull(ptr));
}